

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pragmaVtabCursorClear(PragmaVtabCursor *pCsr)

{
  int local_14;
  int i;
  PragmaVtabCursor *pCsr_local;
  
  sqlite3_finalize(pCsr->pPragma);
  pCsr->pPragma = (sqlite3_stmt *)0x0;
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    sqlite3_free(pCsr->azArg[local_14]);
    pCsr->azArg[local_14] = (char *)0x0;
  }
  return;
}

Assistant:

static void pragmaVtabCursorClear(PragmaVtabCursor *pCsr){
  int i;
  sqlite3_finalize(pCsr->pPragma);
  pCsr->pPragma = 0;
  for(i=0; i<ArraySize(pCsr->azArg); i++){
    sqlite3_free(pCsr->azArg[i]);
    pCsr->azArg[i] = 0;
  }
}